

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createBNot(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  UnaryInstr<(flow::UnaryOperator)2,_(flow::LiteralType)1> *pUVar2;
  long lVar3;
  Value *rhs_local;
  string local_38;
  
  rhs_local = rhs;
  if (rhs->type_ == Boolean) {
    lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<bool,(flow::LiteralType)1>::typeinfo,
                           0);
    if (lVar1 == 0) {
      makeName(&local_38,this,name);
      pUVar2 = insert<flow::UnaryInstr<(flow::UnaryOperator)2,(flow::LiteralType)1>,flow::Value*&,std::__cxx11::string>
                         (this,&rhs_local,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      lVar3 = 0x18;
      if (*(char *)(lVar1 + 0x48) != '\0') {
        lVar3 = 0x68;
      }
      pUVar2 = (UnaryInstr<(flow::UnaryOperator)2,_(flow::LiteralType)1> *)
               ((long)&(this->program_->modules_).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3);
    }
    return (Value *)pUVar2;
  }
  __assert_fail("rhs->type() == LiteralType::Boolean",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x8b,"Value *flow::IRBuilder::createBNot(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createBNot(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return getBoolean(!a->get());

  return insert<BNotInstr>(rhs, makeName(name));
}